

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O3

mdns_record_srv_t *
mdns_record_parse_srv
          (mdns_record_srv_t *__return_storage_ptr__,void *buffer,size_t size,size_t offset,
          size_t length,char *strbuffer,size_t capacity)

{
  ushort uVar1;
  mdns_string_t mVar2;
  size_t local_10;
  
  __return_storage_ptr__->priority = 0;
  __return_storage_ptr__->weight = 0;
  __return_storage_ptr__->port = 0;
  *(undefined2 *)&__return_storage_ptr__->field_0x6 = 0;
  (__return_storage_ptr__->name).str = (char *)0x0;
  (__return_storage_ptr__->name).length = 0;
  if (7 < length && length + offset <= size) {
    __return_storage_ptr__->priority =
         *(ushort *)((long)buffer + offset) << 8 | *(ushort *)((long)buffer + offset) >> 8;
    uVar1 = *(ushort *)((long)buffer + offset + 2);
    __return_storage_ptr__->weight = uVar1 << 8 | uVar1 >> 8;
    uVar1 = *(ushort *)((long)buffer + offset + 4);
    __return_storage_ptr__->port = uVar1 << 8 | uVar1 >> 8;
    local_10 = offset + 6;
    mVar2 = mdns_string_extract(buffer,size,&local_10,strbuffer,capacity);
    __return_storage_ptr__->name = mVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

mdns_record_srv_t
mdns_record_parse_srv(const void* buffer, size_t size, size_t offset, size_t length,
                      char* strbuffer, size_t capacity) {
	mdns_record_srv_t srv;
	memset(&srv, 0, sizeof(mdns_record_srv_t));
	// Read the priority, weight, port number and the discovery name
	// SRV record format (http://www.ietf.org/rfc/rfc2782.txt):
	// 2 bytes network-order unsigned priority
	// 2 bytes network-order unsigned weight
	// 2 bytes network-order unsigned port
	// string: discovery (domain) name, minimum 2 bytes when compressed
	if ((size >= offset + length) && (length >= 8)) {
		const uint16_t* recorddata = (const uint16_t*)((const char*)buffer + offset);
		srv.priority = ntohs(*recorddata++);
		srv.weight = ntohs(*recorddata++);
		srv.port = ntohs(*recorddata++);
		offset += 6;
		srv.name = mdns_string_extract(buffer, size, &offset, strbuffer, capacity);
	}
	return srv;
}